

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  char *str;
  size_t sVar2;
  Message local_38;
  Int32 local_2c [2];
  Int32 result;
  
  str = getenv(var);
  if (str != (char *)0x0) {
    Message::Message(&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_38.ss_.ptr_ + 0x10),"The value of environment variable ",0x22
              );
    if (var == (char *)0x0) {
      sVar2 = 6;
      var = "(null)";
    }
    else {
      sVar2 = strlen(var);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_38.ss_.ptr_ + 0x10),var,sVar2);
    bVar1 = ParseInt32(&local_38,str,local_2c);
    if (local_38.ss_.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38.ss_.ptr_ + 8))(local_38.ss_.ptr_);
    }
    default_val = local_2c[0];
    if (!bVar1) {
      exit(1);
    }
  }
  return default_val;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}